

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void recmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int p_00;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double *local_48;
  
  uVar5 = (ulong)(uint)p;
  local_48 = B;
LAB_0011a1d1:
  do {
    uVar2 = n;
    if (n < m) {
      uVar2 = m;
    }
    while( true ) {
      p_00 = (int)uVar5;
      if (n + m + p_00 < 0xc1) {
        uVar4 = 0;
        uVar10 = (ulong)(uint)n;
        if (n < 1) {
          uVar10 = uVar4;
        }
        if (p_00 < 1) {
          uVar5 = 0;
        }
        uVar3 = (ulong)(uint)m;
        if (m < 1) {
          uVar3 = uVar4;
        }
        for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
          pdVar6 = local_48;
          for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
            lVar1 = uVar8 + uVar4 * (long)sC;
            pdVar9 = pdVar6;
            for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
              C[lVar1] = A[uVar11] * *pdVar9 + C[lVar1];
              pdVar9 = pdVar9 + sC;
            }
            pdVar6 = pdVar6 + 1;
          }
          A = A + sB;
        }
        return;
      }
      if ((n <= m) && (p_00 <= m)) {
        dVar12 = ceil((double)m * 0.5);
        iVar7 = (int)dVar12;
        recmult(A,local_48,C,iVar7,n,p_00,sA,sB,sC);
        A = A + iVar7 * sB;
        m = m - iVar7;
        C = C + iVar7 * sC;
        goto LAB_0011a1d1;
      }
      if ((m <= n) && (p_00 <= n)) break;
      if (p_00 < (int)uVar2) {
        return;
      }
      dVar12 = ceil((double)p_00 * 0.5);
      iVar7 = (int)dVar12;
      recmult(A,local_48,C,m,n,iVar7,sA,sB,sC);
      local_48 = local_48 + iVar7;
      C = C + iVar7;
      uVar5 = (ulong)(uint)(p_00 - iVar7);
    }
    dVar12 = ceil((double)n * 0.5);
    iVar7 = (int)dVar12;
    recmult(A,local_48,C,m,iVar7,p_00,sA,sB,sC);
    A = A + iVar7;
    n = n - iVar7;
    local_48 = local_48 + iVar7 * sC;
  } while( true );
}

Assistant:

void recmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	int m2,n2,p2;
	register int i,j,k;
	int u,v,t;
	if (m + n + p <= CUTOFF) {
		//#pragma omp parallel for private(i,j,k,v,u,t)
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sB;
				u = i * sC;
				t = j + u;
				for (k = 0; k < n;++k) {
					C[t] += A[k + v] * B[j + k * sC];
				}
			}
		}

		
	} else if (m >= n && m >= p) {
		m2 = (int) ceil((double) m / 2.0);
		recmult(A,B,C,m2,n,p,sA,sB,sC);
		recmult(A + m2*sB,B,C + m2*sC,m-m2,n,p,sA,sB,sC);
		
	} else if (n >= m && n >= p) {
		n2 = (int) ceil((double) n / 2.0);
		recmult(A,B,C,m,n2,p,sA,sB,sC);
		recmult(A+n2,B+n2*sC,C,m,n-n2,p,sA,sB,sC);
		
	} else if (p >= m && p >= n) {
		p2 = (int) ceil((double) p / 2.0);
		recmult(A,B,C,m,n,p2,sA,sB,sC);
		recmult(A,B+p2,C+p2,m,n,p-p2,sA,sB,sC);
	}
}